

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

char  [7] kj::_::Debug::makeDescription<unsigned_int&>(char *macroArgs,StringPtr *params)

{
  StringPtr *this;
  kj *in_RDX;
  size_t in_R8;
  ArrayPtr<kj::String> argValues_00;
  ArrayPtr<kj::String> AVar1;
  String *local_90;
  undefined1 local_38 [8];
  char argValues [1] [7];
  StringPtr *params_local;
  char *macroArgs_local;
  
  params_local = params;
  macroArgs_local = macroArgs;
  str<unsigned_int&>((String *)local_38,in_RDX,(uint *)in_RDX);
  this = params_local;
  AVar1 = arrayPtr<kj::String>((String *)local_38,1);
  argValues_00.size_ = in_R8;
  argValues_00.ptr = (String *)AVar1.size_;
  makeDescriptionInternal((String *)macroArgs,(Debug *)this,(char *)AVar1.ptr,argValues_00);
  local_90 = (String *)&stack0xffffffffffffffe0;
  do {
    local_90 = local_90 + -1;
    String::~String(local_90);
  } while (local_90 != (String *)local_38);
  return SUB87(macroArgs,0);
}

Assistant:

String Debug::makeDescription(const char* macroArgs, Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  return makeDescriptionInternal(macroArgs, arrayPtr(argValues, sizeof...(Params)));
}